

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

Level * __thiscall
hta::Metric::restore_level(Level *__return_storage_ptr__,Metric *this,Duration interval)

{
  _Head_base<0UL,_hta::storage::Metric_*,_false> _Var1;
  long args_3;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  iterator __begin3;
  TimeValue *pTVar5;
  undefined8 uVar6;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> data;
  TimeValue *local_68;
  TimeValue *local_60;
  long local_58;
  
  (__return_storage_ptr__->time_current).
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       0;
  (__return_storage_ptr__->aggregate).minimum = INFINITY;
  (__return_storage_ptr__->aggregate).maximum = -INFINITY;
  (__return_storage_ptr__->aggregate).sum = 0.0;
  (__return_storage_ptr__->aggregate).count = 0;
  (__return_storage_ptr__->aggregate).integral = 0.0;
  (__return_storage_ptr__->aggregate).active_time.__r = 0;
  iVar2 = (*((this->storage_metric_)._M_t.
             super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
             ._M_t.
             super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
             .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[10])
                    ();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    uVar6 = 0x300000001;
    _Var1._M_head_impl =
         (this->storage_metric_)._M_t.
         super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
         _M_t.
         super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
         super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
    iVar2 = (*(_Var1._M_head_impl)->_vptr_Metric[0xb])(_Var1._M_head_impl,interval.__r);
    if (CONCAT44(extraout_var_00,iVar2) == 0) {
      uVar6 = 0x300000003;
      lVar3 = 0;
    }
    else {
      _Var1._M_head_impl =
           (this->storage_metric_)._M_t.
           super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
           _M_t.
           super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
           .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_Metric[9])(&local_68,_Var1._M_head_impl,interval.__r);
      lVar3 = (long)&(local_68->time).
                     super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     .__d.__r + interval.__r;
      (__return_storage_ptr__->time_current).
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = lVar3;
    }
    if ((this->interval_min_).__r == interval.__r) {
      _Var1._M_head_impl =
           (this->storage_metric_)._M_t.
           super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
           _M_t.
           super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
           .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_Metric[5])(&local_68,_Var1._M_head_impl,lVar3,0,uVar6);
      if (local_68 != local_60) {
        pTVar5 = local_68;
        if ((__return_storage_ptr__->time_current).
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r == 0) {
          (__return_storage_ptr__->time_current).
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r = (local_68->time).
                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    .__d.__r;
        }
        do {
          Level::advance(__return_storage_ptr__,*pTVar5);
          pTVar5 = pTVar5 + 1;
        } while (pTVar5 != local_60);
      }
    }
    else {
      args_3 = (this->interval_factor_).factor_;
      if ((interval.__r < 1) || (interval.__r % args_3 != 0)) {
        throw_exception<hta::Exception,char_const*,long,char_const*,long>
                  ("interval ",interval.__r," not divisible by ",args_3);
      }
      _Var1._M_head_impl =
           (this->storage_metric_)._M_t.
           super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
           _M_t.
           super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
           .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_Metric[6])
                (&local_68,_Var1._M_head_impl,lVar3,0,interval.__r / args_3,uVar6);
      if (local_68 != local_60) {
        lVar3 = (__return_storage_ptr__->time_current).
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r;
        pTVar5 = local_68;
        do {
          lVar4 = (pTVar5->time).
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r + interval.__r / args_3;
          if (lVar4 < lVar3) {
            __assert_fail("ta.time >= time_current",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/level.hpp"
                          ,0x39,"void hta::Level::advance(TimeAggregate)");
          }
          Aggregate::operator+=(&__return_storage_ptr__->aggregate,*(Aggregate *)&pTVar5->value);
          (__return_storage_ptr__->time_current).
          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          __d.__r = lVar4;
          pTVar5 = (TimeValue *)&pTVar5[3].value;
          lVar3 = lVar4;
        } while (pTVar5 != local_60);
      }
    }
    if (local_68 != (TimeValue *)0x0) {
      operator_delete(local_68,local_58 - (long)local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Level Metric::restore_level(Duration interval)
{
    Level level;
    if (storage_metric_->size() == 0)
    {
        // No need to restore anything.
        return level;
    }

    // How much did we already store here?
    TimePoint time_closed;
    Scope scope_begin = Scope::infinity;
    if (storage_metric_->size(interval))
    {
        time_closed = storage_metric_->last(interval).time + interval;
        scope_begin = Scope ::closed;
        level.time_current = time_closed;
    }

    if (interval == interval_min_)
    {
        auto data =
            storage_metric_->get(time_closed, {}, IntervalScope{ scope_begin, Scope::infinity });
        if (!data.empty())
        {
            if (!level.time_current)
            {
                level.time_current = data[0].time;
            }
            for (auto& tv : data)
            {
                level.advance(tv);
            }
        }
    }
    else
    {
        auto smaller_interval = interval / interval_factor_;
        auto data = storage_metric_->get(time_closed, {}, smaller_interval,
                                         IntervalScope{ scope_begin, Scope::infinity });
        for (auto& ta : data)
        {
            level.advance({ ta.time + smaller_interval, ta.aggregate });
        }
    }
    return level;
}